

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O3

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_4UL>::push_back
          (CircularArray<(anonymous_namespace)::TestObject,_4UL> *this,value_type *value)

{
  TestObject *pTVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = this->size_;
  if (uVar2 < 4) {
    this->size_ = uVar2 + 1;
    pTVar1 = (this->contents_)._M_elems + ((int)uVar2 + (int)this->front_ & 3);
    if (pTVar1->moved == false) {
      ::(anonymous_namespace)::TestObject::destruct_count =
           ::(anonymous_namespace)::TestObject::destruct_count + 1;
    }
    pTVar1->moved = false;
    pTVar1->data = 0;
    pTVar1->data2 = 0;
    iVar3 = value->data2;
    pTVar1->data = value->data;
    pTVar1->data2 = iVar3;
    ::(anonymous_namespace)::TestObject::construct_count =
         ::(anonymous_namespace)::TestObject::construct_count + 1;
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<(anonymous namespace)::TestObject, 4>::push_back(const value_type &) [T = (anonymous namespace)::TestObject, kCapacity = 4]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }